

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

bool __thiscall p2t::Sweep::Legalize(Sweep *this,SweepContext *tcx,Triangle *t)

{
  bool bVar1;
  int iVar2;
  Triangle *this_00;
  Point *p_00;
  Point *p_01;
  Point *pb;
  Point *pc;
  bool not_legalized;
  bool inside;
  int oi;
  Point *op;
  Point *p;
  Triangle *ot;
  int i;
  Triangle *t_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  ot._4_4_ = 0;
  do {
    if (2 < ot._4_4_) {
      return false;
    }
    if (((t->delaunay_edge[ot._4_4_] & 1U) == 0) &&
       (this_00 = Triangle::GetNeighbor(t,ot._4_4_), this_00 != (Triangle *)0x0)) {
      p_00 = Triangle::GetPoint(t,ot._4_4_);
      p_01 = Triangle::OppositePoint(this_00,t,p_00);
      iVar2 = Triangle::Index(this_00,p_01);
      if (((this_00->constrained_edge[iVar2] & 1U) == 0) &&
         ((this_00->delaunay_edge[iVar2] & 1U) == 0)) {
        pb = Triangle::PointCCW(t,p_00);
        pc = Triangle::PointCW(t,p_00);
        bVar1 = Incircle(this,p_00,pb,pc,p_01);
        if (bVar1) {
          t->delaunay_edge[ot._4_4_] = true;
          this_00->delaunay_edge[iVar2] = true;
          RotateTrianglePair(this,t,p_00,this_00,p_01);
          bVar1 = Legalize(this,tcx,t);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            SweepContext::MapTriangleToNodes(tcx,t);
          }
          bVar1 = Legalize(this,tcx,this_00);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            SweepContext::MapTriangleToNodes(tcx,this_00);
          }
          t->delaunay_edge[ot._4_4_] = false;
          this_00->delaunay_edge[iVar2] = false;
          return true;
        }
      }
      else {
        t->constrained_edge[ot._4_4_] = (bool)(this_00->constrained_edge[iVar2] & 1);
      }
    }
    ot._4_4_ = ot._4_4_ + 1;
  } while( true );
}

Assistant:

bool Sweep::Legalize(SweepContext& tcx, Triangle& t)
{
  // To legalize a triangle we start by finding if any of the three edges
  // violate the Delaunay condition
  for (int i = 0; i < 3; i++) {
    if (t.delaunay_edge[i])
      continue;

    Triangle* ot = t.GetNeighbor(i);

    if (ot) {
      Point* p = t.GetPoint(i);
      Point* op = ot->OppositePoint(t, *p);
      int oi = ot->Index(op);

      // If this is a Constrained Edge or a Delaunay Edge(only during recursive legalization)
      // then we should not try to legalize
      if (ot->constrained_edge[oi] || ot->delaunay_edge[oi]) {
        t.constrained_edge[i] = ot->constrained_edge[oi];
        continue;
      }

      bool inside = Incircle(*p, *t.PointCCW(*p), *t.PointCW(*p), *op);

      if (inside) {
        // Lets mark this shared edge as Delaunay
        t.delaunay_edge[i] = true;
        ot->delaunay_edge[oi] = true;

        // Lets rotate shared edge one vertex CW to legalize it
        RotateTrianglePair(t, *p, *ot, *op);

        // We now got one valid Delaunay Edge shared by two triangles
        // This gives us 4 new edges to check for Delaunay

        // Make sure that triangle to node mapping is done only one time for a specific triangle
        bool not_legalized = !Legalize(tcx, t);
        if (not_legalized) {
          tcx.MapTriangleToNodes(t);
        }

        not_legalized = !Legalize(tcx, *ot);
        if (not_legalized)
          tcx.MapTriangleToNodes(*ot);

        // Reset the Delaunay edges, since they only are valid Delaunay edges
        // until we add a new triangle or point.
        // XXX: need to think about this. Can these edges be tried after we
        //      return to previous recursive level?
        t.delaunay_edge[i] = false;
        ot->delaunay_edge[oi] = false;

        // If triangle have been legalized no need to check the other edges since
        // the recursive legalization will handles those so we can end here.
        return true;
      }
    }
  }
  return false;
}